

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O0

void __thiscall
HighsCutGeneration::updateViolationAndNorm
          (HighsCutGeneration *this,HighsInt index,double aj,double *violation,double *norm)

{
  double dVar1;
  const_reference pvVar2;
  double *in_RCX;
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)in_ESI);
  *in_RDX = in_XMM0_Qa * *pvVar2 + *in_RDX;
  if ((in_XMM0_Qa <= 0.0) ||
     (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)in_ESI),
     *(double *)(in_RDI + 0xb0) < *pvVar2)) {
    if (in_XMM0_Qa < 0.0) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)in_ESI);
      dVar1 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)in_ESI);
      if (*pvVar2 - *(double *)(in_RDI + 0xb0) <= dVar1) {
        return;
      }
    }
    *in_RCX = in_XMM0_Qa * in_XMM0_Qa + *in_RCX;
  }
  return;
}

Assistant:

void HighsCutGeneration::updateViolationAndNorm(HighsInt index, double aj,
                                                double& violation,
                                                double& norm) const {
  // update violation
  violation += aj * solval[index];

  // update norm
  if (aj > 0 && solval[index] <= feastol) return;
  if (aj < 0 && solval[index] >= upper[index] - feastol) return;
  norm += aj * aj;
}